

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_picker.cpp
# Opt level: O0

add_hashes_result * __thiscall
libtorrent::aux::hash_picker::add_hashes
          (add_hashes_result *__return_storage_ptr__,hash_picker *this,hash_request *req,
          span<const_libtorrent::digest32<256L>_> hashes)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  piece_index_t lhs;
  int *piVar4;
  index_type iVar5;
  value_type *this_00;
  add_hashes_result_t *paVar6;
  span<const_libtorrent::digest32<256L>_> uncle_hashes_00;
  span<const_libtorrent::digest32<256L>_> sVar7;
  span<const_libtorrent::digest32<256L>_> local_138;
  diff_type local_124;
  undefined1 local_120 [8];
  optional<libtorrent::aux::add_hashes_result_t> results;
  diff_type file_piece_offset;
  int dest_start_idx;
  value_type *dst_tree;
  add_hashes_result ret;
  hash_picker *phStack_78;
  int base_layer_idx;
  digest32<256L> *local_70;
  span<const_libtorrent::digest32<256L>_> uncle_hashes;
  int local_50 [3];
  int local_44;
  int num_uncle_hashes;
  int base_num_layers;
  int leaf_count;
  int local_34;
  hash_request *phStack_30;
  int unpadded_count;
  hash_request *req_local;
  hash_picker *this_local;
  span<const_libtorrent::digest32<256L>_> hashes_local;
  
  hashes_local.m_ptr = (digest32<256L> *)hashes.m_len;
  this_local = (hash_picker *)hashes.m_ptr;
  base_num_layers = (req->file).m_val;
  phStack_30 = req;
  req_local = (hash_request *)this;
  hashes_local.m_len = (difference_type)__return_storage_ptr__;
  iVar2 = file_storage::file_num_pieces(this->m_files,(file_index_t)base_num_layers);
  leaf_count = iVar2 - phStack_30->index;
  piVar4 = ::std::min<int>(&req->count,&leaf_count);
  local_34 = *piVar4;
  num_uncle_hashes = merkle_num_leafs(phStack_30->count);
  local_44 = merkle_num_layers(num_uncle_hashes);
  local_50[1] = 0;
  local_50[0] = (phStack_30->proof_layers - local_44) + 1;
  piVar4 = ::std::max<int>(local_50 + 1,local_50);
  local_50[2] = *piVar4;
  iVar3 = phStack_30->count + local_50[2];
  iVar5 = span<const_libtorrent::digest32<256L>_>::size
                    ((span<const_libtorrent::digest32<256L>_> *)&this_local);
  iVar2 = local_34;
  if (iVar3 == iVar5) {
    if (((phStack_30->base == this->m_piece_layer) && (phStack_30->count != 0x200)) &&
       ((0x200 < phStack_30->count ||
        (iVar3 = file_storage::file_num_pieces(this->m_files,(file_index_t)(phStack_30->file).m_val)
        , iVar2 != iVar3 - phStack_30->index)))) {
      add_hashes_result::add_hashes_result(__return_storage_ptr__,false);
    }
    else if ((phStack_30->base == this->m_piece_layer) || (phStack_30->base == 0)) {
      uncle_hashes_00 =
           span<const_libtorrent::digest32<256L>_>::subspan
                     ((span<const_libtorrent::digest32<256L>_> *)&this_local,(long)phStack_30->count
                     );
      sVar7 = span<const_libtorrent::digest32<256L>_>::first
                        ((span<const_libtorrent::digest32<256L>_> *)&this_local,
                         (long)phStack_30->count);
      phStack_78 = (hash_picker *)sVar7.m_ptr;
      this_local = phStack_78;
      local_70 = (digest32<256L> *)sVar7.m_len;
      hashes_local.m_ptr = local_70;
      ret.hash_passed.
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (phStack_30->file).m_val;
      iVar2 = file_num_layers(this,ret.hash_passed.
                                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      ret.hash_passed.
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar2 - phStack_30->base;
      if (ret.hash_passed.
          super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 1) {
        add_hashes_result::add_hashes_result(__return_storage_ptr__,false);
      }
      else {
        add_hashes_result::add_hashes_result((add_hashes_result *)&dst_tree,true);
        this_00 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                  ::operator[](this->m_merkle_trees,
                               (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                               (phStack_30->file).m_val);
        iVar2 = merkle_to_flat_index
                          (ret.hash_passed.
                           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           phStack_30->index);
        results.super__Optional_base<libtorrent::aux::add_hashes_result_t,_false,_false>._M_payload.
        super__Optional_payload<libtorrent::aux::add_hashes_result_t,_true,_false,_false>.
        super__Optional_payload_base<libtorrent::aux::add_hashes_result_t>._52_4_ =
             (phStack_30->file).m_val;
        lhs = file_storage::piece_index_at_file
                        (this->m_files,
                         (file_index_t)
                         results.
                         super__Optional_base<libtorrent::aux::add_hashes_result_t,_false,_false>.
                         _M_payload.
                         super__Optional_payload<libtorrent::aux::add_hashes_result_t,_true,_false,_false>
                         .super__Optional_payload_base<libtorrent::aux::add_hashes_result_t>._52_4_)
        ;
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                  ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                   &results.super__Optional_base<libtorrent::aux::add_hashes_result_t,_false,_false>
                    ._M_payload.
                    super__Optional_payload<libtorrent::aux::add_hashes_result_t,_true,_false,_false>
                    .super__Optional_payload_base<libtorrent::aux::add_hashes_result_t>._M_engaged,0
                  );
        local_124 = aux::operator-(lhs.m_val,
                                   (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)
                                   results.
                                   super__Optional_base<libtorrent::aux::add_hashes_result_t,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<libtorrent::aux::add_hashes_result_t,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<libtorrent::aux::add_hashes_result_t>
                                   ._48_4_);
        span<libtorrent::digest32<256l>const>::
        span<libtorrent::span<libtorrent::digest32<256l>const>,libtorrent::digest32<256l>const,void>
                  ((span<libtorrent::digest32<256l>const> *)&local_138,
                   (span<const_libtorrent::digest32<256L>_> *)&this_local);
        merkle_tree::add_hashes
                  ((optional<libtorrent::aux::add_hashes_result_t> *)local_120,this_00,iVar2,
                   local_124,local_138,uncle_hashes_00);
        bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_120);
        if (bVar1) {
          paVar6 = ::std::optional<libtorrent::aux::add_hashes_result_t>::operator->
                             ((optional<libtorrent::aux::add_hashes_result_t> *)local_120);
          ::std::
          vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::operator=((vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)&ret,&paVar6->failed);
          paVar6 = ::std::optional<libtorrent::aux::add_hashes_result_t>::operator->
                             ((optional<libtorrent::aux::add_hashes_result_t> *)local_120);
          ::std::
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          ::operator=((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       *)&ret.hash_failed.
                          super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&paVar6->passed);
          add_hashes_result::add_hashes_result
                    (__return_storage_ptr__,(add_hashes_result *)&dst_tree);
        }
        else {
          add_hashes_result::add_hashes_result(__return_storage_ptr__,false);
        }
        ::std::optional<libtorrent::aux::add_hashes_result_t>::~optional
                  ((optional<libtorrent::aux::add_hashes_result_t> *)local_120);
        add_hashes_result::~add_hashes_result((add_hashes_result *)&dst_tree);
      }
    }
    else {
      add_hashes_result::add_hashes_result(__return_storage_ptr__,false);
    }
    return __return_storage_ptr__;
  }
  add_hashes_result::add_hashes_result(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

add_hashes_result hash_picker::add_hashes(hash_request const& req, span<sha256_hash const> hashes)
	{
		TORRENT_ASSERT(validate_hash_request(req, m_files));

		int const unpadded_count = std::min(req.count, m_files.file_num_pieces(req.file) - req.index);
		int const leaf_count = merkle_num_leafs(req.count);
		int const base_num_layers = merkle_num_layers(leaf_count);
		int const num_uncle_hashes = std::max(0, req.proof_layers - base_num_layers + 1);

		if (req.count + num_uncle_hashes != hashes.size())
			return add_hashes_result(false);

		// for now we rely on only requesting piece hashes in 512 chunks
		if (req.base == m_piece_layer
			&& req.count != 512
			&& (req.count > 512 || unpadded_count != m_files.file_num_pieces(req.file) - req.index))
			return add_hashes_result(false);

		// for now we only support receiving hashes at the piece and leaf layers
		if (req.base != m_piece_layer && req.base != 0)
			return add_hashes_result(false);

		// the incoming list of hashes is really two separate lists, the lowest
		// layer of hashes we requested (typically the block- or piece layer).
		// There are req.count of those, then there are the uncle hashes
		// required to prove the correctness of the first hashes, to anchor the
		// new hashes in the existing tree
		auto const uncle_hashes = hashes.subspan(req.count);
		hashes = hashes.first(req.count);

		TORRENT_ASSERT(uncle_hashes.size() == num_uncle_hashes);

		int const base_layer_idx = file_num_layers(req.file) - req.base;

		if (base_layer_idx <= 0)
			return add_hashes_result(false);

		add_hashes_result ret(true);

		auto& dst_tree = m_merkle_trees[req.file];
		int const dest_start_idx = merkle_to_flat_index(base_layer_idx, req.index);
		auto const file_piece_offset = m_files.piece_index_at_file(req.file) - piece_index_t{0};
		auto results = dst_tree.add_hashes(dest_start_idx, file_piece_offset, hashes, uncle_hashes);

		if (!results)
			return add_hashes_result(false);

		ret.hash_failed = std::move(results->failed);
		ret.hash_passed = std::move(results->passed);

		return ret;
	}